

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O2

void __thiscall
duckdb::MergeJoinGlobalState::MergeJoinGlobalState
          (MergeJoinGlobalState *this,ClientContext *context,PhysicalPiecewiseMergeJoin *op)

{
  undefined8 __p;
  const_reference pvVar1;
  const_reference this_00;
  vector<duckdb::BoundOrderByNode,_true> rhs_order;
  BoundOrderByNode local_a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_90;
  RowLayout rhs_layout;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__MergeJoinGlobalState_017a8da8;
  (this->table).
  super_unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  .super__Head_base<0UL,_duckdb::PhysicalRangeJoin::GlobalSortedTable_*,_false>._M_head_impl =
       (GlobalSortedTable *)0x0;
  RowLayout::RowLayout(&rhs_layout);
  pvVar1 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                     (&(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin
                       .super_CachingPhysicalOperator.super_PhysicalOperator.children,1);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_90,
             &(pvVar1->_M_data->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  RowLayout::Initialize(&rhs_layout,(vector<duckdb::LogicalType,_true> *)&local_90,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_90);
  rhs_order.super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rhs_order.super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rhs_order.super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = vector<duckdb::BoundOrderByNode,_true>::get<true>(&op->rhs_orders,0);
  BoundOrderByNode::Copy(&local_a8,this_00);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
  emplace_back<duckdb::BoundOrderByNode>
            (&rhs_order.
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>,
             &local_a8);
  BoundOrderByNode::~BoundOrderByNode(&local_a8);
  make_uniq<duckdb::PhysicalRangeJoin::GlobalSortedTable,duckdb::ClientContext&,duckdb::vector<duckdb::BoundOrderByNode,true>&,duckdb::RowLayout&,duckdb::PhysicalPiecewiseMergeJoin_const&>
            ((duckdb *)&local_a8,context,&rhs_order,&rhs_layout,op);
  __p = local_a8._0_8_;
  local_a8._0_8_ =
       (__uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
        )0x0;
  ::std::
  __uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ::reset((__uniq_ptr_impl<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
           *)&this->table,(pointer)__p);
  ::std::
  unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
  ::~unique_ptr((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>_>
                 *)&local_a8);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
            (&rhs_order.
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>);
  RowLayout::~RowLayout(&rhs_layout);
  return;
}

Assistant:

MergeJoinGlobalState(ClientContext &context, const PhysicalPiecewiseMergeJoin &op) {
		RowLayout rhs_layout;
		rhs_layout.Initialize(op.children[1].get().GetTypes());
		vector<BoundOrderByNode> rhs_order;
		rhs_order.emplace_back(op.rhs_orders[0].Copy());
		table = make_uniq<GlobalSortedTable>(context, rhs_order, rhs_layout, op);
	}